

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<long_long,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  longlong u2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  longlong t;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcb8
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcc0
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcc8
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcd0
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcd8
  ;
  longlong in_stack_fffffffffffffce0;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffce8
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  byte local_11;
  longlong local_10;
  longlong local_8;
  
  local_8 = 0;
  local_10 = 0;
  local_11 = 0;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_20,&local_8);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_28,&local_8);
  SVar1.m_int = local_28.m_int;
  local_11 = (local_11 ^ 0xff) & 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(longlong *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(longlong *)in_stack_fffffffffffffcc8.m_int);
  local_20.m_int = SVar1.m_int;
  SafeInt::operator_cast_to_long_long
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator*(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcd0);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcd0);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator/(in_stack_fffffffffffffce0,in_stack_fffffffffffffce8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcd0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator+(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcd0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  local_8 = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator-(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcd0);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,(int *)in_stack_fffffffffffffcc8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator<<(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcd0.m_int,in_stack_fffffffffffffcd8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator>>(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator&(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator|(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc8.m_int,in_stack_fffffffffffffcc0.m_int);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  operator^(in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcc8);
  local_10 = SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffcc0.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcc0.m_int,in_stack_fffffffffffffcb8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  local_11 = operator<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.m_int);
  local_11 = operator<(in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  local_11 = operator<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator<=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator<=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.m_int);
  local_11 = operator<=(in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  local_11 = operator<=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.m_int);
  local_11 = operator>(in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  local_11 = operator>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator>=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator>=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.m_int);
  local_11 = operator>=(in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  local_11 = operator>=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator==(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_11 = operator==(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8.m_int);
  local_11 = operator==(in_stack_fffffffffffffcb8.m_int,in_stack_fffffffffffffcc0);
  operator==(local_28,in_stack_fffffffffffffcb8);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}